

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractContentContext::gs(AbstractContentContext *this,string *inGraphicStateName)

{
  EStatusCode EVar1;
  allocator<char> local_39;
  string local_38;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  PrimitiveObjectsWriter::WriteName(&this->mPrimitiveWriter,inGraphicStateName,eTokenSeparatorSpace)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"gs",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::gs(const std::string& inGraphicStateName)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteName(inGraphicStateName);
	mPrimitiveWriter.WriteKeyword("gs");
	return GetCurrentStatusCode();
}